

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O1

void nn_cipc_destroy(nn_epbase *self)

{
  if (self != (nn_epbase *)0x0) {
    self = (nn_epbase *)(self + -6);
  }
  nn_sipc_term((nn_sipc *)&((nn_fsm *)((long)self + 0x3c8))->state);
  nn_backoff_term((nn_backoff *)&((nn_fsm *)((long)self + 0x2c0))->owner);
  nn_usock_term((nn_usock *)&((nn_fsm *)((long)self + 0x58))->srcptr);
  nn_fsm_term((nn_fsm *)self);
  nn_epbase_term((nn_epbase *)&((nn_fsm *)((long)self + 0x58))->shutdown_fn);
  nn_free(self);
  return;
}

Assistant:

static void nn_cipc_destroy (struct nn_epbase *self)
{
    struct nn_cipc *cipc;

    cipc = nn_cont (self, struct nn_cipc, epbase);

    nn_sipc_term (&cipc->sipc);
    nn_backoff_term (&cipc->retry);
    nn_usock_term (&cipc->usock);
    nn_fsm_term (&cipc->fsm);
    nn_epbase_term (&cipc->epbase);

    nn_free (cipc);
}